

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlvoid.c
# Opt level: O2

filepos_t EBML_VoidReplaceWith
                    (ebml_element *Void,ebml_element *ReplacedWith,stream *Output,
                    bool_t ComeBackAfterward,bool_t bWithDefault)

{
  long Length;
  long Length_00;
  uint __line;
  byte bVar1;
  uint8_t uVar2;
  bool_t bVar3;
  filepos_t fVar4;
  filepos_t fVar5;
  undefined8 uVar6;
  ebml_element *Void_00;
  char *__assertion;
  long lVar7;
  
  bVar3 = Node_IsPartOf(Void,0x44564245);
  if (bVar3 == 0) {
    __assertion = "Node_IsPartOf(Void,EBML_VOID_CLASS)";
    __line = 0x4d;
  }
  else {
    if (ReplacedWith != (ebml_element *)0x0) {
      (**(code **)((long)(ReplacedWith->Base).Base.VMT + 0x98))(ReplacedWith,bWithDefault,0);
      fVar4 = EBML_ElementFullSize(Void,1);
      fVar5 = EBML_ElementFullSize(ReplacedWith,1);
      if (fVar5 <= fVar4) {
        fVar4 = EBML_ElementFullSize(Void,1);
        fVar5 = EBML_ElementFullSize(ReplacedWith,1);
        if (fVar4 - fVar5 != 1) {
          if (Output != (stream *)0x0) {
            uVar6 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
            (**(code **)((long)(Output->Base).VMT + 0x78))(Output,Void->ElementPosition,0);
            EBML_ElementRender(ReplacedWith,Output,bWithDefault,0,1,-1,(filepos_t *)0x0);
            fVar4 = EBML_ElementFullSize(Void,1);
            fVar5 = EBML_ElementFullSize(ReplacedWith,1);
            if (1 < fVar4 - fVar5) {
              Void_00 = EBML_ElementCreate(Void,Void->Context,0,-1);
              if (Void_00 != (ebml_element *)0x0) {
                fVar4 = EBML_ElementFullSize(Void,1);
                fVar5 = EBML_ElementFullSize(ReplacedWith,1);
                EBML_VoidSetFullSize(Void_00,fVar4 - fVar5);
                fVar4 = EBML_ElementFullSize(Void_00,1);
                Length = Void_00->DataSize;
                uVar2 = Void_00->SizeLength;
                bVar3 = EBML_ElementIsFiniteSize(Void_00);
                bVar1 = EBML_CodedSizeLength(Length,uVar2,bVar3);
                Void_00->DataSize = Length - (ulong)bVar1;
                fVar5 = EBML_ElementFullSize(Void_00,1);
                Length_00 = Void_00->DataSize;
                lVar7 = fVar5 - Length_00;
                if (fVar4 - Length != lVar7) {
                  uVar2 = Void_00->SizeLength;
                  bVar3 = EBML_ElementIsFiniteSize(Void_00);
                  uVar2 = EBML_CodedSizeLength(Length_00,uVar2,bVar3);
                  Void_00->SizeLength = ((char)(fVar4 - Length) - (char)lVar7) + uVar2;
                }
                EBML_ElementRenderHead(Void_00,Output,0,(filepos_t *)0x0);
                NodeDelete((node *)Void_00);
              }
            }
            if (ComeBackAfterward != 0) {
              (**(code **)((long)(Output->Base).VMT + 0x78))(Output,uVar6,0);
            }
            fVar4 = EBML_ElementFullSize(Void,1);
            return fVar4;
          }
          __assertion = "(const void*)(Output)!=NULL";
          __line = 0x57;
          goto LAB_0011c43f;
        }
      }
      return -1;
    }
    __assertion = "(const void*)(ReplacedWith)!=NULL";
    __line = 0x4f;
  }
LAB_0011c43f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlvoid.c"
                ,__line,
                "filepos_t EBML_VoidReplaceWith(ebml_element *, ebml_element *, struct stream *, bool_t, bool_t)"
               );
}

Assistant:

filepos_t EBML_VoidReplaceWith(ebml_element *Void, ebml_element *ReplacedWith, struct stream *Output, bool_t ComeBackAfterward, bool_t bWithDefault)
{
    filepos_t CurrentPosition;
    assert(Node_IsPartOf(Void,EBML_VOID_CLASS));

	EBML_ElementUpdateSize(ReplacedWith,bWithDefault,0, EBML_ANY_PROFILE);
	if (EBML_ElementFullSize(Void,1) < EBML_ElementFullSize(ReplacedWith,1))
		// the element can't be written here !
		return INVALID_FILEPOS_T;
	if (EBML_ElementFullSize(Void,1) - EBML_ElementFullSize(ReplacedWith,1) == 1)
		// there is not enough space to put a filling element
		return INVALID_FILEPOS_T;

	CurrentPosition = Stream_Seek(Output,0,SEEK_CUR);

    Stream_Seek(Output,Void->ElementPosition,SEEK_SET);
    EBML_ElementRender(ReplacedWith,Output,bWithDefault,0,1,EBML_ANY_PROFILE,NULL);

    if (EBML_ElementFullSize(Void,1) - EBML_ElementFullSize(ReplacedWith,1) > 1)
    {
        // fill the rest with another void element
        ebml_element *aTmp = EBML_ElementCreate(Void,Void->Context,0,EBML_ANY_PROFILE);
        if (aTmp)
        {
            filepos_t HeadBefore,HeadAfter;
            EBML_VoidSetFullSize(aTmp, EBML_ElementFullSize(Void,1) - EBML_ElementFullSize(ReplacedWith,1));
            HeadBefore = EBML_ElementFullSize(aTmp,1) - aTmp->DataSize;
            aTmp->DataSize = aTmp->DataSize - EBML_CodedSizeLength(aTmp->DataSize, aTmp->SizeLength, EBML_ElementIsFiniteSize(aTmp));
            HeadAfter = EBML_ElementFullSize(aTmp,1) - aTmp->DataSize;
            if (HeadBefore != HeadAfter)
                aTmp->SizeLength = (int8_t)(EBML_CodedSizeLength(aTmp->DataSize, aTmp->SizeLength, EBML_ElementIsFiniteSize(aTmp)) - (HeadAfter - HeadBefore));
            EBML_ElementRenderHead(aTmp,Output,0,NULL);
            NodeDelete((node*)aTmp);
        }
    }

	if (ComeBackAfterward)
        Stream_Seek(Output,CurrentPosition,SEEK_SET);

	return EBML_ElementFullSize(Void,1);
}